

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall tinygltf::Material::operator==(Material *this,Material *other)

{
  pointer pdVar1;
  pointer pdVar2;
  size_t __n;
  bool bVar3;
  __type _Var4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar3 = PbrMetallicRoughness::operator==(&this->pbrMetallicRoughness,&other->pbrMetallicRoughness)
  ;
  if ((((bVar3) &&
       (bVar3 = NormalTextureInfo::operator==(&this->normalTexture,&other->normalTexture), bVar3))
      && (bVar3 = OcclusionTextureInfo::operator==(&this->occlusionTexture,&other->occlusionTexture)
         , bVar3)) &&
     (bVar3 = TextureInfo::operator==(&this->emissiveTexture,&other->emissiveTexture), bVar3)) {
    pdVar1 = (this->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (other->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (long)(this->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pdVar1;
    if (uVar7 == (long)(other->emissiveFactor).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) {
      uVar6 = (uint)(uVar7 >> 3);
      if (0 < (int)uVar6) {
        uVar7 = 0;
        do {
          if (1e-12 <= ABS(pdVar2[uVar7] - pdVar1[uVar7])) {
            return false;
          }
          uVar7 = uVar7 + 1;
        } while ((uVar6 & 0x7fffffff) != uVar7);
      }
      __n = (this->alphaMode)._M_string_length;
      if (__n == (other->alphaMode)._M_string_length) {
        if ((__n != 0) &&
           (iVar5 = bcmp((this->alphaMode)._M_dataplus._M_p,(other->alphaMode)._M_dataplus._M_p,__n)
           , iVar5 != 0)) {
          return false;
        }
        if ((((ABS(other->alphaCutoff - this->alphaCutoff) < 1e-12) &&
             (this->doubleSided == other->doubleSided)) &&
            (((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
              (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count &&
             ((((bVar3 = std::__equal<false>::
                         equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                                   ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_left,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                                             )&(this->extensions)._M_t._M_impl.super__Rb_tree_header
                                    ,(other->extensions)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_left), bVar3 &&
                (bVar3 = Equals(&this->extras,&other->extras), bVar3)) &&
               ((this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                (other->values)._M_t._M_impl.super__Rb_tree_header._M_node_count)) &&
              ((bVar3 = std::__equal<false>::
                        equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>>
                                  ((this->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>
                                            )&(this->values)._M_t._M_impl.super__Rb_tree_header,
                                   (other->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left), bVar3 &&
               ((this->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                (other->additionalValues)._M_t._M_impl.super__Rb_tree_header._M_node_count))))))))
           && (bVar3 = std::__equal<false>::
                       equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Parameter>>>
                                 ((this->additionalValues)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_left,
                                  (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Parameter>_>
                                   )&(this->additionalValues)._M_t._M_impl.super__Rb_tree_header,
                                  (other->additionalValues)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_left), bVar3)) {
          _Var4 = std::operator==(&this->name,&other->name);
          return _Var4;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Material::operator==(const Material &other) const {
  return (this->pbrMetallicRoughness == other.pbrMetallicRoughness) &&
         (this->normalTexture == other.normalTexture) &&
         (this->occlusionTexture == other.occlusionTexture) &&
         (this->emissiveTexture == other.emissiveTexture) &&
         Equals(this->emissiveFactor, other.emissiveFactor) &&
         (this->alphaMode == other.alphaMode) &&
         TINYGLTF_DOUBLE_EQUAL(this->alphaCutoff, other.alphaCutoff) &&
         (this->doubleSided == other.doubleSided) &&
         (this->extensions == other.extensions) &&
         (this->extras == other.extras) && (this->values == other.values) &&
         (this->additionalValues == other.additionalValues) &&
         (this->name == other.name);
}